

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O1

void GC::CheckArrayElements(char *ptr,uint size,ExternTypeInfo *elementType)

{
  if (elementType->pointerCount != 0) {
    switch(elementType->subCat) {
    case CAT_ARRAY:
      if (size != 0) {
        do {
          CheckArray(ptr,elementType);
          ptr = ptr + elementType->size;
          size = size - 1;
        } while (size != 0);
      }
      break;
    case CAT_POINTER:
      if (size != 0) {
        do {
          CheckPointer(ptr);
          ptr = ptr + elementType->size;
          size = size - 1;
        } while (size != 0);
      }
      break;
    case CAT_FUNCTION:
      if (size != 0) {
        do {
          CheckFunction(ptr);
          ptr = ptr + elementType->size;
          size = size - 1;
        } while (size != 0);
      }
      break;
    case CAT_CLASS:
      if (size != 0) {
        do {
          CheckClass(ptr,elementType);
          ptr = ptr + elementType->size;
          size = size - 1;
        } while (size != 0);
      }
    }
  }
  return;
}

Assistant:

void CheckArrayElements(char* ptr, unsigned size, const ExternTypeInfo& elementType)
	{
		if(!elementType.pointerCount)
			return;

		// Check every array element
		switch(elementType.subCat)
		{
		case ExternTypeInfo::CAT_NONE:
			break;
		case ExternTypeInfo::CAT_ARRAY:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckArray(ptr, elementType);
			break;
		case ExternTypeInfo::CAT_POINTER:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckPointer(ptr);
			break;
		case ExternTypeInfo::CAT_FUNCTION:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckFunction(ptr);
			break;
		case ExternTypeInfo::CAT_CLASS:
			for(unsigned i = 0; i < size; i++, ptr += elementType.size)
				CheckClass(ptr, elementType);
			break;
		}
	}